

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

float_specs
fmt::v8::detail::parse_float_type_spec<fmt::v8::detail::error_handler&,char>
          (basic_format_specs<char> *specs,error_handler *eh)

{
  error_handler eVar1;
  char *in_RSI;
  error_handler *in_RDI;
  float_specs result;
  float_specs local_8;
  
  local_8 = (float_specs)
            ((ulong)((*(ushort *)(in_RDI + 9) & 0x80) << 0xd | ((byte)in_RDI[10] & 1) << 0x11) <<
            0x20);
  eVar1 = in_RDI[8];
  if (eVar1 == (error_handler)0x0) {
    return local_8;
  }
  if (eVar1 == (error_handler)0x41) {
    local_8 = (float_specs)((ulong)local_8 | 0x1000000000000);
LAB_0014faaf:
    local_8 = (float_specs)((ulong)local_8 | 0x300000000);
  }
  else {
    if (eVar1 == (error_handler)0x45) {
      local_8 = (float_specs)((ulong)local_8 | 0x1000000000000);
LAB_0014f9e6:
      local_8 = (float_specs)
                ((ulong)(local_8._4_4_ & 0xffefffff | 1 |
                        (uint)(local_8._4_4_ >> 0x14 != 0 || *(int *)(in_RDI + 4) != 0) << 0x14) <<
                0x20);
      return local_8;
    }
    if (eVar1 == (error_handler)0x46) {
      local_8 = (float_specs)((ulong)local_8 | 0x1000000000000);
    }
    else {
      if (eVar1 == (error_handler)0x47) {
        local_8 = (float_specs)((ulong)local_8 | 0x1000000000000);
        return local_8;
      }
      if (eVar1 == (error_handler)0x61) goto LAB_0014faaf;
      if (eVar1 == (error_handler)0x65) goto LAB_0014f9e6;
      if (eVar1 != (error_handler)0x66) {
        if (eVar1 == (error_handler)0x67) {
          return local_8;
        }
        error_handler::on_error(in_RDI,in_RSI);
      }
    }
    local_8 = (float_specs)
              ((ulong)(local_8._4_4_ & 0xffefffff | 2 |
                      (uint)(local_8._4_4_ >> 0x14 != 0 || *(int *)(in_RDI + 4) != 0) << 0x14) <<
              0x20);
  }
  return local_8;
}

Assistant:

FMT_CONSTEXPR auto parse_float_type_spec(const basic_format_specs<Char>& specs,
                                         ErrorHandler&& eh = {})
    -> float_specs {
  auto result = float_specs();
  result.showpoint = specs.alt;
  result.locale = specs.localized;
  switch (specs.type) {
  case 0:
    result.format = float_format::general;
    break;
  case 'G':
    result.upper = true;
    FMT_FALLTHROUGH;
  case 'g':
    result.format = float_format::general;
    break;
  case 'E':
    result.upper = true;
    FMT_FALLTHROUGH;
  case 'e':
    result.format = float_format::exp;
    result.showpoint |= specs.precision != 0;
    break;
  case 'F':
    result.upper = true;
    FMT_FALLTHROUGH;
  case 'f':
    result.format = float_format::fixed;
    result.showpoint |= specs.precision != 0;
    break;
  case 'A':
    result.upper = true;
    FMT_FALLTHROUGH;
  case 'a':
    result.format = float_format::hex;
    break;
  default:
    eh.on_error("invalid type specifier");
    break;
  }
  return result;
}